

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  int iVar1;
  long lVar2;
  int iVar3;
  float fVar4;
  int local_48;
  float local_44;
  float local_40;
  UNITY_DOUBLE factor_1;
  UNITY_DOUBLE divisor;
  UNITY_DOUBLE factor;
  char buf [16];
  int local_20;
  int digits;
  int decimals;
  int exponent;
  UNITY_INT32 n;
  UNITY_INT32 n_int;
  UNITY_DOUBLE number;
  UNITY_DOUBLE input_number_local;
  
  n = (UNITY_INT32)input_number;
  if (input_number < 0.0) {
    putchar(0x2d);
    n = (UNITY_INT32)-input_number;
  }
  if (((float)n != 0.0) || (NAN((float)n))) {
    if (NAN((float)n)) {
      UnityPrint("nan");
    }
    else {
      iVar3 = 1;
      if (n < 0) {
        iVar3 = -1;
      }
      iVar1 = 0;
      if (ABS((float)n) == INFINITY) {
        iVar1 = iVar3;
      }
      if (iVar1 == 0) {
        exponent = 0;
        digits = 0;
        memset(&divisor,0,0x10);
        if (1.0 <= (float)n) {
          if ((float)n <= 1e+07) {
            local_44 = 1.0;
            exponent = (int)(float)n;
            fVar4 = (float)exponent;
            for (; exponent < 1000000; exponent = exponent * 10) {
              local_44 = local_44 * 10.0;
              digits = digits + -1;
            }
            n = (UNITY_INT32)(local_44 * ((float)n - fVar4));
          }
          else {
            local_40 = 1.0;
            for (; 1e+16 < (float)n; n = (UNITY_INT32)((float)n / 1e+10)) {
              digits = digits + 10;
            }
            for (; 1e+07 < (float)n / local_40; local_40 = local_40 * 10.0) {
              digits = digits + 1;
            }
            n = (UNITY_INT32)((float)n / local_40);
          }
        }
        else {
          factor_1 = 1.0;
          for (; (float)n < 0.001; n = (UNITY_INT32)((float)n * 1e+10)) {
            digits = digits + -10;
          }
          for (; (float)n * factor_1 < 1e+06; factor_1 = factor_1 * 10.0) {
            digits = digits + -1;
          }
          n = (UNITY_INT32)(factor_1 * (float)n);
        }
        decimals = ((int)((float)n + (float)n) + 1) / 2;
        if ((((decimals & 1U) != 0) && ((float)decimals - (float)n == 0.5)) &&
           (!NAN((float)decimals - (float)n))) {
          decimals = decimals - 1;
        }
        decimals = exponent + decimals;
        if (9999999 < decimals) {
          decimals = 1000000;
          digits = digits + 1;
        }
        if ((digits < 1) && (-0xb < digits)) {
          local_48 = -digits;
        }
        else {
          local_48 = 6;
        }
        digits = local_48 + digits;
        for (local_20 = local_48; 0 < local_20 && decimals % 10 == 0; local_20 = local_20 + -1) {
          decimals = decimals / 10;
        }
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        for (; decimals != 0 || (int)buf._12_4_ < local_20 + 1; decimals = decimals / 10) {
          lVar2 = (long)(int)buf._12_4_;
          buf._12_4_ = buf._12_4_ + 1;
          *(char *)((long)&divisor + lVar2) = (char)(decimals % 10) + '0';
        }
        while (0 < (int)buf._12_4_) {
          if (buf._12_4_ == local_20) {
            putchar(0x2e);
          }
          buf._12_4_ = buf._12_4_ + -1;
          putchar((int)*(char *)((long)&divisor + (long)(int)buf._12_4_));
        }
        if (digits != 0) {
          putchar(0x65);
          if (digits < 0) {
            putchar(0x2d);
            digits = -digits;
          }
          else {
            putchar(0x2b);
          }
          buf[0xc] = '\0';
          buf[0xd] = '\0';
          buf[0xe] = '\0';
          buf[0xf] = '\0';
          for (; digits != 0 || (int)buf._12_4_ < 2; digits = digits / 10) {
            lVar2 = (long)(int)buf._12_4_;
            buf._12_4_ = buf._12_4_ + 1;
            *(char *)((long)&divisor + lVar2) = (char)(digits % 10) + '0';
          }
          while (0 < (int)buf._12_4_) {
            buf._12_4_ = buf._12_4_ + -1;
            putchar((int)*(char *)((long)&divisor + (long)(int)buf._12_4_));
          }
        }
      }
      else {
        UnityPrint("inf");
      }
    }
  }
  else {
    UnityPrint("0");
  }
  return;
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
#ifdef UNITY_INCLUDE_DOUBLE
    static const int sig_digits = 9;
    static const UNITY_INT32 min_scaled = 100000000;
    static const UNITY_INT32 max_scaled = 1000000000;
#else
    static const int sig_digits = 7;
    static const UNITY_INT32 min_scaled = 1000000;
    static const UNITY_INT32 max_scaled = 10000000;
#endif

    UNITY_DOUBLE number = input_number;

    /* print minus sign (does not handle negative zero) */
    if (number < 0.0f)
    {
        UNITY_OUTPUT_CHAR('-');
        number = -number;
    }

    /* handle zero, NaN, and +/- infinity */
    if (number == 0.0f)
    {
        UnityPrint("0");
    }
    else if (isnan(number))
    {
        UnityPrint("nan");
    }
    else if (isinf(number))
    {
        UnityPrint("inf");
    }
    else
    {
        UNITY_INT32 n_int = 0, n;
        int exponent = 0;
        int decimals, digits;
        char buf[16] = {0};

        /*
         * Scale up or down by powers of 10.  To minimize rounding error,
         * start with a factor/divisor of 10^10, which is the largest
         * power of 10 that can be represented exactly.  Finally, compute
         * (exactly) the remaining power of 10 and perform one more
         * multiplication or division.
         */
        if (number < 1.0f)
        {
            UNITY_DOUBLE factor = 1.0f;

            while (number < (UNITY_DOUBLE)max_scaled / 1e10f)  { number *= 1e10f; exponent -= 10; }
            while (number * factor < (UNITY_DOUBLE)min_scaled) { factor *= 10.0f; exponent--; }

            number *= factor;
        }
        else if (number > (UNITY_DOUBLE)max_scaled)
        {
            UNITY_DOUBLE divisor = 1.0f;

            while (number > (UNITY_DOUBLE)min_scaled * 1e10f)   { number  /= 1e10f; exponent += 10; }
            while (number / divisor > (UNITY_DOUBLE)max_scaled) { divisor *= 10.0f; exponent++; }

            number /= divisor;
        }
        else
        {
            /*
             * In this range, we can split off the integer part before
             * doing any multiplications.  This reduces rounding error by
             * freeing up significant bits in the fractional part.
             */
            UNITY_DOUBLE factor = 1.0f;
            n_int = (UNITY_INT32)number;
            number -= (UNITY_DOUBLE)n_int;

            while (n_int < min_scaled) { n_int *= 10; factor *= 10.0f; exponent--; }

            number *= factor;
        }

        /* round to nearest integer */
        n = ((UNITY_INT32)(number + number) + 1) / 2;

#ifndef UNITY_ROUND_TIES_AWAY_FROM_ZERO
        /* round to even if exactly between two integers */
        if ((n & 1) && (((UNITY_DOUBLE)n - number) == 0.5f))
            n--;
#endif

        n += n_int;

        if (n >= max_scaled)
        {
            n = min_scaled;
            exponent++;
        }

        /* determine where to place decimal point */
        decimals = ((exponent <= 0) && (exponent >= -(sig_digits + 3))) ? (-exponent) : (sig_digits - 1);
        exponent += decimals;

        /* truncate trailing zeroes after decimal point */
        while ((decimals > 0) && ((n % 10) == 0))
        {
            n /= 10;
            decimals--;
        }

        /* build up buffer in reverse order */
        digits = 0;
        while ((n != 0) || (digits < (decimals + 1)))
        {
            buf[digits++] = (char)('0' + n % 10);
            n /= 10;
        }
        while (digits > 0)
        {
            if (digits == decimals) { UNITY_OUTPUT_CHAR('.'); }
            UNITY_OUTPUT_CHAR(buf[--digits]);
        }

        /* print exponent if needed */
        if (exponent != 0)
        {
            UNITY_OUTPUT_CHAR('e');

            if (exponent < 0)
            {
                UNITY_OUTPUT_CHAR('-');
                exponent = -exponent;
            }
            else
            {
                UNITY_OUTPUT_CHAR('+');
            }

            digits = 0;
            while ((exponent != 0) || (digits < 2))
            {
                buf[digits++] = (char)('0' + exponent % 10);
                exponent /= 10;
            }
            while (digits > 0)
            {
                UNITY_OUTPUT_CHAR(buf[--digits]);
            }
        }
    }
}